

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

void init_map(void)

{
  GLuint GVar1;
  int iVar2;
  float local_20;
  int ref;
  GLfloat z;
  GLfloat x;
  GLfloat step;
  int k;
  int j;
  int i;
  
  ref = 0;
  x = 0.0;
  for (k = 0; local_20 = 0.0, k < 0x50; k = k + 1) {
    for (step = 0.0; (int)step < 0x50; step = (GLfloat)((int)step + 1)) {
      map_vertices[0][(int)x] = (GLfloat)ref;
      map_vertices[1][(int)x] = 0.0;
      map_vertices[2][(int)x] = local_20;
      local_20 = local_20 + 0.12658228;
      x = (GLfloat)((int)x + 1);
    }
    ref = (int)((float)ref + 0.12658228);
  }
  x = 0.0;
  for (k = 0; k < 0x4f; k = k + 1) {
    iVar2 = (int)x + 1;
    map_line_indices[(int)x] = (k + 1) * 0x50 - 1;
    x = (GLfloat)((int)x + 2);
    map_line_indices[iVar2] = (k + 2) * 0x50 - 1;
  }
  for (k = 0; k < 0x4f; k = k + 1) {
    iVar2 = (int)x + 1;
    map_line_indices[(int)x] = k + 0x18b0;
    x = (GLfloat)((int)x + 2);
    map_line_indices[iVar2] = k + 0x18b1;
  }
  for (k = 0; k < 0x4f; k = k + 1) {
    for (step = 0.0; (int)step < 0x4f; step = (GLfloat)((int)step + 1)) {
      GVar1 = k * 0x50 + (int)step;
      map_line_indices[(int)x] = GVar1;
      map_line_indices[(int)x + 1] = GVar1 + 1;
      map_line_indices[(int)x + 2] = GVar1;
      map_line_indices[(int)x + 3] = GVar1 + 0x50;
      iVar2 = (int)x + 5;
      map_line_indices[(int)x + 4] = GVar1;
      x = (GLfloat)((int)x + 6);
      map_line_indices[iVar2] = GVar1 + 0x51;
    }
  }
  return;
}

Assistant:

static void init_map(void)
{
    int i;
    int j;
    int k;
    GLfloat step = MAP_SIZE / (MAP_NUM_VERTICES - 1);
    GLfloat x = 0.0f;
    GLfloat z = 0.0f;
    /* Create a flat grid */
    k = 0;
    for (i = 0 ; i < MAP_NUM_VERTICES ; ++i)
    {
        for (j = 0 ; j < MAP_NUM_VERTICES ; ++j)
        {
            map_vertices[0][k] = x;
            map_vertices[1][k] = 0.0f;
            map_vertices[2][k] = z;
            z += step;
            ++k;
        }
        x += step;
        z = 0.0f;
    }
#if DEBUG_ENABLED
    for (i = 0 ; i < MAP_NUM_TOTAL_VERTICES ; ++i)
    {
        printf ("Vertice %d (%f, %f, %f)\n",
                i, map_vertices[0][i], map_vertices[1][i], map_vertices[2][i]);

    }
#endif
    /* create indices */
    /* line fan based on i
     * i+1
     * |  / i + n + 1
     * | /
     * |/
     * i --- i + n
     */

    /* close the top of the square */
    k = 0;
    for (i = 0 ; i < MAP_NUM_VERTICES  -1 ; ++i)
    {
        map_line_indices[k++] = (i + 1) * MAP_NUM_VERTICES -1;
        map_line_indices[k++] = (i + 2) * MAP_NUM_VERTICES -1;
    }
    /* close the right of the square */
    for (i = 0 ; i < MAP_NUM_VERTICES -1 ; ++i)
    {
        map_line_indices[k++] = (MAP_NUM_VERTICES - 1) * MAP_NUM_VERTICES + i;
        map_line_indices[k++] = (MAP_NUM_VERTICES - 1) * MAP_NUM_VERTICES + i + 1;
    }

    for (i = 0 ; i < (MAP_NUM_VERTICES - 1) ; ++i)
    {
        for (j = 0 ; j < (MAP_NUM_VERTICES - 1) ; ++j)
        {
            int ref = i * (MAP_NUM_VERTICES) + j;
            map_line_indices[k++] = ref;
            map_line_indices[k++] = ref + 1;

            map_line_indices[k++] = ref;
            map_line_indices[k++] = ref + MAP_NUM_VERTICES;

            map_line_indices[k++] = ref;
            map_line_indices[k++] = ref + MAP_NUM_VERTICES + 1;
        }
    }

#ifdef DEBUG_ENABLED
    for (k = 0 ; k < 2 * MAP_NUM_LINES ; k += 2)
    {
        int beg, end;
        beg = map_line_indices[k];
        end = map_line_indices[k+1];
        printf ("Line %d: %d -> %d (%f, %f, %f) -> (%f, %f, %f)\n",
                k / 2, beg, end,
                map_vertices[0][beg], map_vertices[1][beg], map_vertices[2][beg],
                map_vertices[0][end], map_vertices[1][end], map_vertices[2][end]);
    }
#endif
}